

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O0

void __thiscall OpenMD::Globals::validate(Globals *this)

{
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  int data;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *cons2;
  unsigned_long data_00;
  undefined8 uVar4;
  allocator<char> *__a;
  ostream *poVar5;
  string *psVar6;
  undefined8 uVar7;
  long in_RDI;
  double dVar8;
  ostringstream oss;
  iterator i;
  Component *in_stack_ffffffffffff1e88;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  *in_stack_ffffffffffff1e90;
  OpenMDException *this_00;
  allocator<char> *in_stack_ffffffffffff1ec0;
  string *in_stack_ffffffffffff1ec8;
  undefined6 in_stack_ffffffffffff1ed0;
  undefined1 in_stack_ffffffffffff1ed6;
  undefined1 in_stack_ffffffffffff1ed7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
  *in_stack_ffffffffffff1ef8;
  undefined2 in_stack_ffffffffffff1f00;
  byte in_stack_ffffffffffff1f02;
  undefined1 in_stack_ffffffffffff1f03;
  int in_stack_ffffffffffff1f04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff1f10;
  undefined6 in_stack_ffffffffffff1f18;
  byte in_stack_ffffffffffff1f1e;
  undefined1 in_stack_ffffffffffff1f1f;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff1f20;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff1f28;
  undefined6 in_stack_ffffffffffff1f80;
  byte in_stack_ffffffffffff1f86;
  undefined1 in_stack_ffffffffffff1f87;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff1f88;
  undefined6 in_stack_ffffffffffff1fe0;
  undefined1 in_stack_ffffffffffff1fe6;
  undefined1 in_stack_ffffffffffff1fe7;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff1fe8;
  undefined6 in_stack_ffffffffffff2040;
  undefined1 in_stack_ffffffffffff2046;
  undefined1 in_stack_ffffffffffff2047;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff2048;
  DataHolder *in_stack_ffffffffffff2080;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff20a0;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff20a8;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff2100;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *pPVar9;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff2108;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *cons1;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff2160;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff2168;
  undefined6 in_stack_ffffffffffff21c0;
  undefined1 in_stack_ffffffffffff21c6;
  undefined1 in_stack_ffffffffffff21c7;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff21c8;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff2220;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff2228;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff2280;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff2288;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff22e0;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff22e8;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff2340;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff2348;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff23a0;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff23a8;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff2400;
  undefined6 in_stack_ffffffffffff2408;
  undefined1 in_stack_ffffffffffff240e;
  undefined1 in_stack_ffffffffffff240f;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff2460;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *cons2_00;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff2468;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *cons1_00;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff24c0;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff24c8;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *cons1_01;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *cons1_02;
  string local_da30 [32];
  OpenMDException local_da10 [9];
  Component **local_d898;
  __normal_iterator<OpenMD::Component_**,_std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>_>
  local_d890;
  allocator<char> local_d881;
  string local_d880 [103];
  allocator<char> local_d819;
  string local_d818 [103];
  undefined1 local_d7b1 [513];
  string local_d5b0 [32];
  string local_d590 [39];
  allocator<char> local_d569;
  string local_d568 [103];
  allocator<char> local_d501;
  string local_d500 [103];
  allocator<char> local_d499;
  string local_d498 [512];
  undefined1 local_d298 [64];
  PositiveConstraint local_d258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d238;
  string local_d218 [32];
  PositiveConstraint local_d1f8;
  undefined1 local_d1d1 [104];
  allocator<char> local_d169;
  string local_d168 [256];
  string local_d068 [32];
  string local_d048 [39];
  allocator<char> local_d021;
  string local_d020 [103];
  allocator<char> local_cfb9;
  string local_cfb8 [288];
  string local_ce98 [32];
  PositiveConstraint local_ce78 [2];
  string local_ce38 [32];
  PositiveConstraint local_ce18 [2];
  string local_cdd8 [32];
  PositiveConstraint local_cdb8 [2];
  string local_cd78 [32];
  PositiveConstraint local_cd58 [2];
  string local_cd18 [32];
  NonNegativeConstraint local_ccf8 [2];
  string local_ccb8 [32];
  PositiveConstraint local_cc98 [2];
  string local_cc58 [32];
  NonNegativeConstraint local_cc38 [2];
  string local_cbf8 [32];
  PositiveConstraint local_cbd8;
  allocator<char> local_cbb1;
  string local_cbb0 [103];
  allocator<char> local_cb49;
  string local_cb48 [256];
  string local_ca48 [32];
  string local_ca28 [39];
  allocator<char> local_ca01;
  string local_ca00 [103];
  allocator<char> local_c999;
  string local_c998 [263];
  allocator<char> local_c891;
  string local_c890 [103];
  allocator<char> local_c829;
  string local_c828 [256];
  string local_c728 [32];
  string local_c708 [39];
  allocator<char> local_c6e1;
  string local_c6e0 [103];
  allocator<char> local_c679;
  string local_c678 [263];
  allocator<char> local_c571;
  string local_c570 [103];
  allocator<char> local_c509;
  string local_c508 [103];
  allocator<char> local_c4a1;
  string local_c4a0 [103];
  allocator<char> local_c439;
  string local_c438 [103];
  allocator<char> local_c3d1;
  string local_c3d0 [103];
  allocator<char> local_c369;
  string local_c368 [103];
  allocator<char> local_c301;
  string local_c300 [103];
  allocator<char> local_c299;
  string local_c298 [3232];
  string local_b5f8 [32];
  string local_b5d8 [39];
  undefined1 local_b5b1 [104];
  undefined1 local_b549 [104];
  allocator<char> local_b4e1;
  string local_b4e0 [103];
  allocator<char> local_b479;
  string local_b478 [103];
  allocator<char> local_b411;
  string local_b410 [103];
  allocator<char> local_b3a9;
  string local_b3a8 [103];
  allocator<char> local_b341;
  string local_b340 [103];
  allocator<char> local_b2d9;
  string local_b2d8 [3239];
  allocator<char> local_a631;
  string local_a630 [103];
  allocator<char> local_a5c9;
  string local_a5c8 [103];
  allocator<char> local_a561;
  string local_a560 [103];
  allocator<char> local_a4f9;
  string local_a4f8 [103];
  undefined1 local_a491 [104];
  allocator<char> local_a429;
  string local_a428 [1856];
  string local_9ce8 [32];
  string local_9cc8 [39];
  allocator<char> local_9ca1;
  string local_9ca0 [103];
  allocator<char> local_9c39;
  string local_9c38 [103];
  allocator<char> local_9bd1;
  string local_9bd0 [103];
  allocator<char> local_9b69;
  string local_9b68 [103];
  allocator<char> local_9b01;
  string local_9b00 [103];
  allocator<char> local_9a99;
  string local_9a98 [1888];
  string local_9338 [32];
  string local_9318 [96];
  string local_92b8 [32];
  string local_9298 [96];
  string local_9238 [32];
  PositiveConstraint local_9218 [2];
  string local_91d8 [32];
  NonNegativeConstraint local_91b8 [2];
  string local_9178 [32];
  PositiveConstraint local_9158 [2];
  string local_9118 [32];
  PositiveConstraint local_90f8 [2];
  string local_90b8 [32];
  PositiveConstraint local_9098 [2];
  string local_9058 [32];
  PositiveConstraint local_9038 [2];
  string local_8ff8 [32];
  PositiveConstraint local_8fd8 [2];
  string local_8f98 [32];
  PositiveConstraint local_8f78 [2];
  string local_8f38 [32];
  PositiveConstraint local_8f18 [2];
  string local_8ed8 [32];
  NonNegativeConstraint local_8eb8 [2];
  string local_8e78 [32];
  PositiveConstraint local_8e58 [2];
  string local_8e18 [32];
  NonNegativeConstraint local_8df8 [2];
  string local_8db8 [32];
  PositiveConstraint local_8d98 [2];
  string local_8d58 [32];
  NonNegativeConstraint local_8d38 [2];
  string local_8cf8 [32];
  NonNegativeConstraint local_8cd8 [2];
  string local_8c98 [32];
  NonNegativeConstraint local_8c78 [2];
  string local_8c38 [32];
  string local_8c18 [96];
  string local_8bb8 [32];
  PositiveConstraint local_8b98 [2];
  string local_8b58 [32];
  PositiveConstraint local_8b38;
  allocator<char> local_8b11;
  string local_8b10 [103];
  allocator<char> local_8aa9;
  string local_8aa8 [103];
  allocator<char> local_8a41;
  string local_8a40 [103];
  allocator<char> local_89d9;
  string local_89d8 [103];
  allocator<char> local_8971;
  string local_8970 [103];
  undefined1 local_8909 [104];
  undefined1 local_88a1 [104];
  allocator<char> local_8839;
  string local_8838 [103];
  allocator<char> local_87d1;
  string local_87d0 [103];
  allocator<char> local_8769;
  string local_8768 [103];
  allocator<char> local_8701;
  string local_8700 [103];
  allocator<char> local_8699;
  string local_8698 [103];
  allocator<char> local_8631;
  string local_8630 [103];
  allocator<char> local_85c9;
  string local_85c8 [103];
  allocator<char> local_8561;
  string local_8560 [103];
  allocator<char> local_84f9;
  string local_84f8 [103];
  allocator<char> local_8491;
  string local_8490 [103];
  undefined1 local_8429 [15873];
  string local_4628 [32];
  string local_4608 [39];
  allocator<char> local_45e1;
  string local_45e0 [103];
  allocator<char> local_4579;
  string local_4578 [103];
  allocator<char> local_4511;
  string local_4510 [103];
  allocator<char> local_44a9;
  string local_44a8 [103];
  allocator<char> local_4441;
  string local_4440 [103];
  allocator<char> local_43d9;
  string local_43d8 [103];
  allocator<char> local_4371;
  string local_4370 [103];
  allocator<char> local_4309;
  string local_4308 [103];
  allocator<char> local_42a1;
  string local_42a0 [103];
  undefined1 local_4239 [104];
  undefined1 local_41d1 [104];
  allocator<char> local_4169;
  string local_4168 [103];
  allocator<char> local_4101;
  string local_4100 [103];
  allocator<char> local_4099;
  string local_4098 [103];
  allocator<char> local_4031;
  string local_4030 [103];
  allocator<char> local_3fc9;
  string local_3fc8 [103];
  allocator<char> local_3f61;
  string local_3f60 [103];
  allocator<char> local_3ef9;
  string local_3ef8 [15904];
  string local_d8 [32];
  PositiveConstraint local_b8 [2];
  string local_78 [48];
  string local_48 [72];
  
  DataHolder::validate(in_stack_ffffffffffff2080);
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x68));
  if (!bVar1) {
    isNotEmpty();
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffff1e88);
    bVar1 = NotEmptyConstraint::operator()
                      ((NotEmptyConstraint *)in_stack_ffffffffffff1e90,
                       (string *)in_stack_ffffffffffff1e88);
    std::__cxx11::string::~string(local_48);
    NotEmptyConstraint::~NotEmptyConstraint((NotEmptyConstraint *)0x209f3d);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x68));
      uVar7 = std::__cxx11::string::c_str();
      isNotEmpty();
      ParamConstraintFacade<OpenMD::NotEmptyConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NotEmptyConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_78);
      NotEmptyConstraint::~NotEmptyConstraint((NotEmptyConstraint *)0x209fe6);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xb8));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0xb8));
    bVar1 = PositiveConstraint::operator()(local_b8,dVar8);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20a104);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xb8));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_d8);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20a1b0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xf0));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff1f28,in_stack_ffffffffffff1f20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff1f88,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                       CONCAT17(in_stack_ffffffffffff1f87,
                                CONCAT16(in_stack_ffffffffffff1f86,in_stack_ffffffffffff1f80)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff1fe8,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                       CONCAT17(in_stack_ffffffffffff1fe7,
                                CONCAT16(in_stack_ffffffffffff1fe6,in_stack_ffffffffffff1fe0)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff2048,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                       CONCAT17(in_stack_ffffffffffff2047,
                                CONCAT16(in_stack_ffffffffffff2046,in_stack_ffffffffffff2040)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff20a8,in_stack_ffffffffffff20a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff2108,in_stack_ffffffffffff2100);
    cons1_02 = (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                *)local_41d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff2168,in_stack_ffffffffffff2160);
    pPVar9 = (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)local_4239;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff21c8,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                       CONCAT17(in_stack_ffffffffffff21c7,
                                CONCAT16(in_stack_ffffffffffff21c6,in_stack_ffffffffffff21c0)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff2228,in_stack_ffffffffffff2220);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff2288,in_stack_ffffffffffff2280);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff22e8,in_stack_ffffffffffff22e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff2348,in_stack_ffffffffffff2340);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff23a8,in_stack_ffffffffffff23a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        *)CONCAT17(in_stack_ffffffffffff240f,
                                   CONCAT16(in_stack_ffffffffffff240e,in_stack_ffffffffffff2408)),
                       in_stack_ffffffffffff2400);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff2468,in_stack_ffffffffffff2460);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff24c8,in_stack_ffffffffffff24c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(cons1_02,pPVar9);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffff1e88);
    bVar1 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)CONCAT17(in_stack_ffffffffffff1f1f,
                                     CONCAT16(in_stack_ffffffffffff1f1e,in_stack_ffffffffffff1f18)),
                         in_stack_ffffffffffff1f10);
    std::__cxx11::string::~string(local_4608);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_45e0);
    std::allocator<char>::~allocator(&local_45e1);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_4578);
    std::allocator<char>::~allocator(&local_4579);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_4510);
    std::allocator<char>::~allocator(&local_4511);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_44a8);
    std::allocator<char>::~allocator(&local_44a9);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_4440);
    std::allocator<char>::~allocator(&local_4441);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_43d8);
    std::allocator<char>::~allocator(&local_43d9);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_4370);
    std::allocator<char>::~allocator(&local_4371);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_4308);
    std::allocator<char>::~allocator(&local_4309);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_42a0);
    std::allocator<char>::~allocator(&local_42a1);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string((string *)(local_4239 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_4239);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string((string *)(local_41d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_41d1);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_4168);
    std::allocator<char>::~allocator(&local_4169);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_4100);
    std::allocator<char>::~allocator(&local_4101);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_4098);
    std::allocator<char>::~allocator(&local_4099);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_4030);
    std::allocator<char>::~allocator(&local_4031);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_3fc8);
    std::allocator<char>::~allocator(&local_3fc9);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_3f60);
    std::allocator<char>::~allocator(&local_3f61);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_3ef8);
    std::allocator<char>::~allocator(&local_3ef9);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xf0));
      cons2 = (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
              std::__cxx11::string::c_str();
      cons1_01 = (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)local_8429;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff1f28,in_stack_ffffffffffff1f20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff1f88,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                         CONCAT17(in_stack_ffffffffffff1f87,
                                  CONCAT16(in_stack_ffffffffffff1f86,in_stack_ffffffffffff1f80)));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff1fe8,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                         CONCAT17(in_stack_ffffffffffff1fe7,
                                  CONCAT16(in_stack_ffffffffffff1fe6,in_stack_ffffffffffff1fe0)));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff2048,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                         CONCAT17(in_stack_ffffffffffff2047,
                                  CONCAT16(in_stack_ffffffffffff2046,in_stack_ffffffffffff2040)));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff20a8,in_stack_ffffffffffff20a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff2108,in_stack_ffffffffffff2100);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff2168,in_stack_ffffffffffff2160);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff21c8,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                         CONCAT17(in_stack_ffffffffffff21c7,
                                  CONCAT16(in_stack_ffffffffffff21c6,in_stack_ffffffffffff21c0)));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff2228,in_stack_ffffffffffff2220);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff2288,in_stack_ffffffffffff2280);
      cons1_00 = (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)local_88a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff22e8,in_stack_ffffffffffff22e0);
      cons2_00 = (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)local_8909;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff2348,in_stack_ffffffffffff2340);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff23a8,in_stack_ffffffffffff23a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                          *)CONCAT17(in_stack_ffffffffffff240f,
                                     CONCAT16(in_stack_ffffffffffff240e,in_stack_ffffffffffff2408)),
                         in_stack_ffffffffffff2400);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(cons1_00,cons2_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(cons1_01,cons2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(cons1_02,pPVar9);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffff1e88);
      uVar7 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",cons2,uVar7);
      std::__cxx11::string::~string(local_4628);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_8b10);
      std::allocator<char>::~allocator(&local_8b11);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_8aa8);
      std::allocator<char>::~allocator(&local_8aa9);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_8a40);
      std::allocator<char>::~allocator(&local_8a41);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_89d8);
      std::allocator<char>::~allocator(&local_89d9);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_8970);
      std::allocator<char>::~allocator(&local_8971);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string((string *)(local_8909 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_8909);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string((string *)(local_88a1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_88a1);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_8838);
      std::allocator<char>::~allocator(&local_8839);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_87d0);
      std::allocator<char>::~allocator(&local_87d1);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_8768);
      std::allocator<char>::~allocator(&local_8769);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_8700);
      std::allocator<char>::~allocator(&local_8701);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_8698);
      std::allocator<char>::~allocator(&local_8699);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_8630);
      std::allocator<char>::~allocator(&local_8631);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_85c8);
      std::allocator<char>::~allocator(&local_85c9);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_8560);
      std::allocator<char>::~allocator(&local_8561);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_84f8);
      std::allocator<char>::~allocator(&local_84f9);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_8490);
      std::allocator<char>::~allocator(&local_8491);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string((string *)(local_8429 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_8429);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x140));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x140));
    bVar1 = PositiveConstraint::operator()(&local_8b38,dVar8);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20cb6a);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x140));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_8b58);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20cc16);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x178));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x178));
    bVar1 = PositiveConstraint::operator()(local_8b98,dVar8);
    bVar2 = bVar1 ^ 0xff;
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20cd11);
    if ((bVar2 & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x178));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_8bb8);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20cdbd);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x1b0));
  if (!bVar1) {
    isNotEmpty();
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffff1e88);
    bVar1 = NotEmptyConstraint::operator()
                      ((NotEmptyConstraint *)in_stack_ffffffffffff1e90,
                       (string *)in_stack_ffffffffffff1e88);
    std::__cxx11::string::~string(local_8c18);
    NotEmptyConstraint::~NotEmptyConstraint((NotEmptyConstraint *)0x20cec3);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x1b0));
      uVar7 = std::__cxx11::string::c_str();
      isNotEmpty();
      ParamConstraintFacade<OpenMD::NotEmptyConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NotEmptyConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_8c38);
      NotEmptyConstraint::~NotEmptyConstraint((NotEmptyConstraint *)0x20cf6f);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x200));
  if (!bVar1) {
    isNonNegative();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x200));
    bVar1 = NonNegativeConstraint::operator()(local_8c78,dVar8);
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x20d08d);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x200));
      uVar7 = std::__cxx11::string::c_str();
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_8c98);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x20d139);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x238));
  if (!bVar1) {
    isNonNegative();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x238));
    bVar1 = NonNegativeConstraint::operator()(local_8cd8,dVar8);
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x20d234);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x238));
      uVar7 = std::__cxx11::string::c_str();
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_8cf8);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x20d2e0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x270));
  if (!bVar1) {
    isNonNegative();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x270));
    bVar1 = NonNegativeConstraint::operator()(local_8d38,dVar8);
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x20d3db);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x270));
      uVar7 = std::__cxx11::string::c_str();
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_8d58);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x20d487);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x2a8));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x2a8));
    bVar1 = PositiveConstraint::operator()(local_8d98,dVar8);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20d582);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x2a8));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_8db8);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20d62e);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x2e0));
  if (!bVar1) {
    isNonNegative();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x2e0));
    bVar1 = NonNegativeConstraint::operator()(local_8df8,dVar8);
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x20d729);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x2e0));
      uVar7 = std::__cxx11::string::c_str();
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_8e18);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x20d7d5);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xb28));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0xb28));
    bVar1 = PositiveConstraint::operator()(local_8e58,dVar8);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20d8d0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xb28));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_8e78);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20d97c);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x348));
  if (!bVar1) {
    isNonNegative();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x348));
    bVar1 = NonNegativeConstraint::operator()(local_8eb8,dVar8);
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x20da77);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x348));
      uVar7 = std::__cxx11::string::c_str();
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_8ed8);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x20db23);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x4a8));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x4a8));
    bVar1 = PositiveConstraint::operator()(local_8f18,dVar8);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20dc1e);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x4a8));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_8f38);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20dcca);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x4e0));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x4e0));
    bVar1 = PositiveConstraint::operator()(local_8f78,dVar8);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20ddc5);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x4e0));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_8f98);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20de71);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x550));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x550));
    bVar1 = PositiveConstraint::operator()(local_8fd8,dVar8);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20df6c);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x550));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_8ff8);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20e018);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x588));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x588));
    bVar1 = PositiveConstraint::operator()(local_9038,dVar8);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20e113);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x588));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_9058);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20e1bf);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x610));
  if (!bVar1) {
    isPositive();
    data_00 = Parameter<unsigned_long>::getData((Parameter<unsigned_long> *)(in_RDI + 0x610));
    bVar1 = PositiveConstraint::operator()(local_9098,data_00);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20e2b8);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x610));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_90b8);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20e364);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x6e0));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x6e0));
    bVar1 = PositiveConstraint::operator()(local_90f8,dVar8);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20e45f);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x6e0));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_9118);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20e50b);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x718));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x718));
    bVar1 = PositiveConstraint::operator()(local_9158,dVar8);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20e606);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x718));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_9178);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20e6b2);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x7b0));
  if (!bVar1) {
    isNonNegative();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x7b0));
    bVar1 = NonNegativeConstraint::operator()(local_91b8,dVar8);
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x20e7ad);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x7b0));
      uVar7 = std::__cxx11::string::c_str();
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_91d8);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x20e859);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x7e8));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x7e8));
    bVar1 = PositiveConstraint::operator()(local_9218,dVar8);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20e954);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x7e8));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_9238);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x20ea00);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x820));
  if (!bVar1) {
    isNotEmpty();
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffff1e88);
    bVar1 = NotEmptyConstraint::operator()
                      ((NotEmptyConstraint *)in_stack_ffffffffffff1e90,
                       (string *)in_stack_ffffffffffff1e88);
    std::__cxx11::string::~string(local_9298);
    NotEmptyConstraint::~NotEmptyConstraint((NotEmptyConstraint *)0x20eb06);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x820));
      uVar7 = std::__cxx11::string::c_str();
      isNotEmpty();
      ParamConstraintFacade<OpenMD::NotEmptyConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NotEmptyConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_92b8);
      NotEmptyConstraint::~NotEmptyConstraint((NotEmptyConstraint *)0x20ebb2);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x870));
  if (!bVar1) {
    isNotEmpty();
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffff1e88);
    bVar1 = NotEmptyConstraint::operator()
                      ((NotEmptyConstraint *)in_stack_ffffffffffff1e90,
                       (string *)in_stack_ffffffffffff1e88);
    bVar2 = bVar1 ^ 0xff;
    std::__cxx11::string::~string(local_9318);
    NotEmptyConstraint::~NotEmptyConstraint((NotEmptyConstraint *)0x20ecdb);
    if ((bVar2 & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x870));
      uVar7 = std::__cxx11::string::c_str();
      isNotEmpty();
      ParamConstraintFacade<OpenMD::NotEmptyConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NotEmptyConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_9338);
      NotEmptyConstraint::~NotEmptyConstraint((NotEmptyConstraint *)0x20ed87);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xb60));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff1f28,in_stack_ffffffffffff1f20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff1f88,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                       CONCAT17(in_stack_ffffffffffff1f87,
                                CONCAT16(in_stack_ffffffffffff1f86,in_stack_ffffffffffff1f80)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff1fe8,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                       CONCAT17(in_stack_ffffffffffff1fe7,
                                CONCAT16(in_stack_ffffffffffff1fe6,in_stack_ffffffffffff1fe0)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff2048,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                       CONCAT17(in_stack_ffffffffffff2047,
                                CONCAT16(in_stack_ffffffffffff2046,in_stack_ffffffffffff2040)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff20a8,in_stack_ffffffffffff20a0);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffff1e88);
    bVar1 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)CONCAT17(in_stack_ffffffffffff1f1f,
                                     CONCAT16(in_stack_ffffffffffff1f1e,in_stack_ffffffffffff1f18)),
                         in_stack_ffffffffffff1f10);
    std::__cxx11::string::~string(local_9cc8);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_9ca0);
    std::allocator<char>::~allocator(&local_9ca1);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_9c38);
    std::allocator<char>::~allocator(&local_9c39);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_9bd0);
    std::allocator<char>::~allocator(&local_9bd1);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_9b68);
    std::allocator<char>::~allocator(&local_9b69);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_9b00);
    std::allocator<char>::~allocator(&local_9b01);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_9a98);
    std::allocator<char>::~allocator(&local_9a99);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xb60));
      in_stack_ffffffffffff2168 =
           (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
            *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      in_stack_ffffffffffff2160 =
           (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)local_a491;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff1f28,in_stack_ffffffffffff1f20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff1f88,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                         CONCAT17(in_stack_ffffffffffff1f87,
                                  CONCAT16(in_stack_ffffffffffff1f86,in_stack_ffffffffffff1f80)));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff1fe8,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                         CONCAT17(in_stack_ffffffffffff1fe7,
                                  CONCAT16(in_stack_ffffffffffff1fe6,in_stack_ffffffffffff1fe0)));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff2048,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                         CONCAT17(in_stack_ffffffffffff2047,
                                  CONCAT16(in_stack_ffffffffffff2046,in_stack_ffffffffffff2040)));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff20a8,in_stack_ffffffffffff20a0);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffff1e88);
      uVar7 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",
               in_stack_ffffffffffff2168,uVar7);
      std::__cxx11::string::~string(local_9ce8);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_a630);
      std::allocator<char>::~allocator(&local_a631);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_a5c8);
      std::allocator<char>::~allocator(&local_a5c9);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_a560);
      std::allocator<char>::~allocator(&local_a561);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_a4f8);
      std::allocator<char>::~allocator(&local_a4f9);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string((string *)(local_a491 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_a491);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_a428);
      std::allocator<char>::~allocator(&local_a429);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x9f0));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff1f28,in_stack_ffffffffffff1f20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff1f88,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                       CONCAT17(in_stack_ffffffffffff1f87,
                                CONCAT16(in_stack_ffffffffffff1f86,in_stack_ffffffffffff1f80)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff1fe8,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                       CONCAT17(in_stack_ffffffffffff1fe7,
                                CONCAT16(in_stack_ffffffffffff1fe6,in_stack_ffffffffffff1fe0)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff2048,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                       CONCAT17(in_stack_ffffffffffff2047,
                                CONCAT16(in_stack_ffffffffffff2046,in_stack_ffffffffffff2040)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff20a8,in_stack_ffffffffffff20a0);
    cons1 = (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             *)local_b549;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(cons1,in_stack_ffffffffffff2100);
    pPVar9 = (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)local_b5b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff2168,in_stack_ffffffffffff2160);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffff1e88);
    bVar1 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)CONCAT17(in_stack_ffffffffffff1f1f,
                                     CONCAT16(in_stack_ffffffffffff1f1e,in_stack_ffffffffffff1f18)),
                         in_stack_ffffffffffff1f10);
    std::__cxx11::string::~string(local_b5d8);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string((string *)(local_b5b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b5b1);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string((string *)(local_b549 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b549);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_b4e0);
    std::allocator<char>::~allocator(&local_b4e1);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_b478);
    std::allocator<char>::~allocator(&local_b479);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_b410);
    std::allocator<char>::~allocator(&local_b411);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_b3a8);
    std::allocator<char>::~allocator(&local_b3a9);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_b340);
    std::allocator<char>::~allocator(&local_b341);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_b2d8);
    std::allocator<char>::~allocator(&local_b2d9);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x9f0));
      uVar7 = std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff1f28,in_stack_ffffffffffff1f20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff1f88,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                         CONCAT17(in_stack_ffffffffffff1f87,
                                  CONCAT16(in_stack_ffffffffffff1f86,in_stack_ffffffffffff1f80)));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff1fe8,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                         CONCAT17(in_stack_ffffffffffff1fe7,
                                  CONCAT16(in_stack_ffffffffffff1fe6,in_stack_ffffffffffff1fe0)));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff2048,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                         CONCAT17(in_stack_ffffffffffff2047,
                                  CONCAT16(in_stack_ffffffffffff2046,in_stack_ffffffffffff2040)));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff20a8,in_stack_ffffffffffff20a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(cons1,pPVar9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff2168,in_stack_ffffffffffff2160);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_b5f8);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_c570);
      std::allocator<char>::~allocator(&local_c571);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_c508);
      std::allocator<char>::~allocator(&local_c509);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_c4a0);
      std::allocator<char>::~allocator(&local_c4a1);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_c438);
      std::allocator<char>::~allocator(&local_c439);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_c3d0);
      std::allocator<char>::~allocator(&local_c3d1);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_c368);
      std::allocator<char>::~allocator(&local_c369);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_c300);
      std::allocator<char>::~allocator(&local_c301);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_c298);
      std::allocator<char>::~allocator(&local_c299);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xa40));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff1f28,in_stack_ffffffffffff1f20);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffff1e88);
    bVar1 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
            operator()((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)CONCAT17(in_stack_ffffffffffff1f1f,
                                   CONCAT16(in_stack_ffffffffffff1f1e,in_stack_ffffffffffff1f18)),
                       in_stack_ffffffffffff1f10);
    std::__cxx11::string::~string(local_c708);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_c6e0);
    std::allocator<char>::~allocator(&local_c6e1);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_c678);
    std::allocator<char>::~allocator(&local_c679);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xa40));
      uVar7 = std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff1f28,in_stack_ffffffffffff1f20);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_c728);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_c890);
      std::allocator<char>::~allocator(&local_c891);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_c828);
      std::allocator<char>::~allocator(&local_c829);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xbb0));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff1f28,in_stack_ffffffffffff1f20);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffff1e88);
    bVar1 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
            operator()((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)CONCAT17(in_stack_ffffffffffff1f1f,
                                   CONCAT16(in_stack_ffffffffffff1f1e,in_stack_ffffffffffff1f18)),
                       in_stack_ffffffffffff1f10);
    std::__cxx11::string::~string(local_ca28);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_ca00);
    std::allocator<char>::~allocator(&local_ca01);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_c998);
    std::allocator<char>::~allocator(&local_c999);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xbb0));
      uVar7 = std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff1f28,in_stack_ffffffffffff1f20);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_ca48);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_cbb0);
      std::allocator<char>::~allocator(&local_cbb1);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_cb48);
      std::allocator<char>::~allocator(&local_cb49);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x6a8));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x6a8));
    bVar1 = PositiveConstraint::operator()(&local_cbd8,dVar8);
    bVar2 = bVar1 ^ 0xff;
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x2119d1);
    if ((bVar2 & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x6a8));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_cbf8);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x211a7d);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xaf0));
  if (!bVar1) {
    isNonNegative();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0xaf0));
    bVar1 = NonNegativeConstraint::operator()(local_cc38,dVar8);
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x211b78);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xaf0));
      uVar7 = std::__cxx11::string::c_str();
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_cc58);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x211c24);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xd50));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0xd50));
    bVar1 = PositiveConstraint::operator()(local_cc98,dVar8);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x211d1f);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xd50));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_ccb8);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x211dcb);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xe58));
  if (!bVar1) {
    isNonNegative();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0xe58));
    bVar1 = NonNegativeConstraint::operator()(local_ccf8,dVar8);
    bVar2 = bVar1 ^ 0xff;
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x211ec6);
    if ((bVar2 & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xe58));
      uVar7 = std::__cxx11::string::c_str();
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_cd18);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x211f72);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xe90));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0xe90));
    bVar1 = PositiveConstraint::operator()(local_cd58,dVar8);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x21206d);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xe90));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_cd78);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x212119);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xf28));
  if (!bVar1) {
    isPositive();
    dVar8 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0xf28));
    bVar1 = PositiveConstraint::operator()(local_cdb8,dVar8);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x212214);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xf28));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_cdd8);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x2122c0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xf60));
  if (!bVar1) {
    isPositive();
    in_stack_ffffffffffff1f88 =
         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
          *)Parameter<double>::getData((Parameter<double> *)(in_RDI + 0xf60));
    in_stack_ffffffffffff1f87 =
         PositiveConstraint::operator()(local_ce18,(double)in_stack_ffffffffffff1f88);
    in_stack_ffffffffffff1f86 = in_stack_ffffffffffff1f87 ^ 0xff;
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x2123bb);
    if ((in_stack_ffffffffffff1f86 & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xf60));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_ce38);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x212467);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xff8));
  if (!bVar1) {
    isPositive();
    data = Parameter<int>::getData((Parameter<int> *)(in_RDI + 0xff8));
    bVar1 = PositiveConstraint::operator()(local_ce78,data);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x21255e);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xff8));
      uVar7 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_ce98);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x21260a);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x11f0));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff1f28,in_stack_ffffffffffff1f20);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffff1e88);
    bVar1 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
            operator()((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)CONCAT17(in_stack_ffffffffffff1f1f,
                                   CONCAT16(in_stack_ffffffffffff1f1e,in_stack_ffffffffffff1f18)),
                       in_stack_ffffffffffff1f10);
    std::__cxx11::string::~string(local_d048);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_d020);
    std::allocator<char>::~allocator(&local_d021);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_cfb8);
    std::allocator<char>::~allocator(&local_cfb9);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x11f0));
      uVar7 = std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      in_stack_ffffffffffff1f28 =
           (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)local_d1d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffff1ed7,
                          CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
                 (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
      isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
      OpenMD::operator||(in_stack_ffffffffffff1f28,in_stack_ffffffffffff1f20);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_d068);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string((string *)(local_d1d1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_d1d1);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_d168);
      std::allocator<char>::~allocator(&local_d169);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x1240));
  if (!bVar1) {
    isPositive();
    in_stack_ffffffffffff1f20 =
         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
         Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x1240));
    in_stack_ffffffffffff1f1f =
         PositiveConstraint::operator()(&local_d1f8,(double)in_stack_ffffffffffff1f20);
    in_stack_ffffffffffff1f1e = in_stack_ffffffffffff1f1f ^ 0xff;
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x212c44);
    if ((in_stack_ffffffffffff1f1e & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x1240));
      uVar7 = std::__cxx11::string::c_str();
      in_stack_ffffffffffff1f10 = &local_d238;
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string(local_d218);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x212cf0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xdd8));
  if (!bVar1) {
    isPositive();
    in_stack_ffffffffffff1f04 = Parameter<int>::getData((Parameter<int> *)(in_RDI + 0xdd8));
    in_stack_ffffffffffff1f03 =
         PositiveConstraint::operator()(&local_d258,in_stack_ffffffffffff1f04);
    in_stack_ffffffffffff1f02 = in_stack_ffffffffffff1f03 ^ 0xff;
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x212dd8);
    if ((in_stack_ffffffffffff1f02 & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xdd8));
      uVar7 = std::__cxx11::string::c_str();
      in_stack_ffffffffffff1ef8 =
           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
            *)local_d298;
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff1e88);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar7,uVar4);
      std::__cxx11::string::~string((string *)(local_d298 + 0x20));
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x212e75);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x14d0));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff1f28,in_stack_ffffffffffff1f20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff1ed7,
                        CONCAT16(in_stack_ffffffffffff1ed6,in_stack_ffffffffffff1ed0)),
               (char *)in_stack_ffffffffffff1ec8,in_stack_ffffffffffff1ec0);
    isEqualIgnoreCase(in_stack_ffffffffffff1ec8);
    OpenMD::operator||(in_stack_ffffffffffff1f88,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                       CONCAT17(in_stack_ffffffffffff1f87,
                                CONCAT16(in_stack_ffffffffffff1f86,in_stack_ffffffffffff1f80)));
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffff1e88);
    uVar3 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)CONCAT17(in_stack_ffffffffffff1f1f,
                                     CONCAT16(in_stack_ffffffffffff1f1e,in_stack_ffffffffffff1f18)),
                         in_stack_ffffffffffff1f10);
    bVar2 = uVar3 ^ 0xff;
    std::__cxx11::string::~string(local_d590);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_d568);
    std::allocator<char>::~allocator(&local_d569);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffff1e90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_d500);
    std::allocator<char>::~allocator(&local_d501);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
    std::__cxx11::string::~string(local_d498);
    std::allocator<char>::~allocator(&local_d499);
    if ((bVar2 & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x14d0));
      __a = (allocator<char> *)std::__cxx11::string::c_str();
      psVar6 = (string *)local_d7b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar3,CONCAT16(bVar2,in_stack_ffffffffffff1ed0)),(char *)psVar6,__a);
      isEqualIgnoreCase(psVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar3,CONCAT16(bVar2,in_stack_ffffffffffff1ed0)),(char *)psVar6,__a);
      isEqualIgnoreCase(psVar6);
      OpenMD::operator||(in_stack_ffffffffffff1f28,in_stack_ffffffffffff1f20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar3,CONCAT16(bVar2,in_stack_ffffffffffff1ed0)),(char *)psVar6,__a);
      isEqualIgnoreCase(psVar6);
      OpenMD::operator||(in_stack_ffffffffffff1f88,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                         CONCAT17(in_stack_ffffffffffff1f87,
                                  CONCAT16(in_stack_ffffffffffff1f86,in_stack_ffffffffffff1f80)));
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffff1e88);
      uVar7 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",__a,uVar7);
      std::__cxx11::string::~string(local_d5b0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_d880);
      std::allocator<char>::~allocator(&local_d881);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffff1e90);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string(local_d818);
      std::allocator<char>::~allocator(&local_d819);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff1e90);
      std::__cxx11::string::~string((string *)(local_d7b1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_d7b1);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  local_d890._M_current =
       (Component **)
       std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::begin
                 ((vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> *)
                  in_stack_ffffffffffff1e88);
  while( true ) {
    local_d898 = (Component **)
                 std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::end
                           ((vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> *)
                            in_stack_ffffffffffff1e88);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Component_**,_std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>_>
                        *)in_stack_ffffffffffff1e90,
                       (__normal_iterator<OpenMD::Component_**,_std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>_>
                        *)in_stack_ffffffffffff1e88);
    if (!bVar1) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<OpenMD::Component_**,_std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>_>
    ::operator*(&local_d890);
    bVar1 = Component::findMoleculeStamp
                      ((Component *)
                       CONCAT44(in_stack_ffffffffffff1f04,
                                CONCAT13(in_stack_ffffffffffff1f03,
                                         CONCAT12(in_stack_ffffffffffff1f02,
                                                  in_stack_ffffffffffff1f00))),
                       in_stack_ffffffffffff1ef8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<OpenMD::Component_**,_std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>_>
    ::operator++(&local_d890);
  }
  this_00 = local_da10;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  poVar5 = std::operator<<((ostream *)this_00,
                           "Globals Error: can not find molecule stamp for component ");
  __gnu_cxx::
  __normal_iterator<OpenMD::Component_**,_std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>_>
  ::operator*(&local_d890);
  Component::getType_abi_cxx11_(in_stack_ffffffffffff1e88);
  psVar6 = (string *)std::operator<<(poVar5,local_da30);
  std::ostream::operator<<(psVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_da30);
  uVar7 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  OpenMDException::OpenMDException(this_00,psVar6);
  __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void Globals::validate() {
    DataHolder::validate();

    CheckParameter(ForceField, isNotEmpty());
    CheckParameter(TargetTemp, isPositive());
    CheckParameter(
        Ensemble,
        isEqualIgnoreCase("NVE") || isEqualIgnoreCase("NVT") ||
            isEqualIgnoreCase("NPTi") || isEqualIgnoreCase("NPTf") ||
            isEqualIgnoreCase("NPTxyz") || isEqualIgnoreCase("NPTsz") ||
            isEqualIgnoreCase("NPAT") || isEqualIgnoreCase("NPA") ||
            isEqualIgnoreCase("LANGEVINDYNAMICS") || isEqualIgnoreCase("LD") ||
            isEqualIgnoreCase("NPRT") || isEqualIgnoreCase("NPGT") ||
            isEqualIgnoreCase("NGammaT") || isEqualIgnoreCase("NGT") ||
            isEqualIgnoreCase("LANGEVINHULL") || isEqualIgnoreCase("LHULL") ||
            isEqualIgnoreCase("SMIPD") || isEqualIgnoreCase("LANGEVINPISTON"));
    CheckParameter(Dt, isPositive());
    CheckParameter(RunTime, isPositive());
    CheckParameter(FinalConfig, isNotEmpty());
    CheckParameter(SampleTime, isNonNegative());
    CheckParameter(ResetTime, isNonNegative());
    CheckParameter(StatusTime, isNonNegative());
    CheckParameter(CutoffRadius, isPositive());
    CheckParameter(SwitchingRadius, isNonNegative());
    CheckParameter(Dielectric, isPositive());
    CheckParameter(ThermalTime, isNonNegative());
    CheckParameter(TauThermostat, isPositive());
    CheckParameter(TauBarostat, isPositive());
    CheckParameter(ZconsTime, isPositive());
    CheckParameter(ZconsTol, isPositive());
    CheckParameter(Seed, isPositive());
    CheckParameter(ZconsGap, isPositive());
    CheckParameter(ZconsFixtime, isPositive());
    CheckParameter(ThermodynamicIntegrationLambda, isNonNegative());
    CheckParameter(ThermodynamicIntegrationK, isPositive());
    CheckParameter(ForceFieldVariant, isNotEmpty());
    CheckParameter(ForceFieldFileName, isNotEmpty());
    CheckParameter(CutoffMethod, isEqualIgnoreCase("HARD") ||
                                     isEqualIgnoreCase("SWITCHED") ||
                                     isEqualIgnoreCase("SHIFTED_POTENTIAL") ||
                                     isEqualIgnoreCase("SHIFTED_FORCE") ||
                                     isEqualIgnoreCase("TAYLOR_SHIFTED") ||
                                     isEqualIgnoreCase("EWALD_FULL"));
    CheckParameter(ElectrostaticSummationMethod,
                   isEqualIgnoreCase("NONE") || isEqualIgnoreCase("HARD") ||
                       isEqualIgnoreCase("SWITCHED") ||
                       isEqualIgnoreCase("SHIFTED_POTENTIAL") ||
                       isEqualIgnoreCase("SHIFTED_FORCE") ||
                       isEqualIgnoreCase("REACTION_FIELD") ||
                       isEqualIgnoreCase("TAYLOR_SHIFTED") ||
                       isEqualIgnoreCase("EWALD_FULL"));
    CheckParameter(
        ElectrostaticScreeningMethod,
        isEqualIgnoreCase("UNDAMPED") || isEqualIgnoreCase("DAMPED"));
    CheckParameter(SwitchingFunctionType,
                   isEqualIgnoreCase("CUBIC") ||
                       isEqualIgnoreCase("FIFTH_ORDER_POLYNOMIAL"));
    CheckParameter(OrthoBoxTolerance, isPositive());
    CheckParameter(DampingAlpha, isNonNegative());
    CheckParameter(SkinThickness, isPositive());
    CheckParameter(Viscosity, isNonNegative());
    CheckParameter(BeadSize, isPositive());
    CheckParameter(FrozenBufferRadius, isPositive());
    CheckParameter(LangevinBufferRadius, isPositive());
    CheckParameter(NeighborListNeighbors, isPositive());
    CheckParameter(HULL_Method, isEqualIgnoreCase("Convex") ||
                                    isEqualIgnoreCase("AlphaShape"));
    CheckParameter(Alpha, isPositive());
    CheckParameter(StatFilePrecision, isPositive());
    CheckParameter(PrivilegedAxis, isEqualIgnoreCase("x") ||
                                       isEqualIgnoreCase("y") ||
                                       isEqualIgnoreCase("z"));

    for (std::vector<Component*>::iterator i = components_.begin();
         i != components_.end(); ++i) {
      if (!(*i)->findMoleculeStamp(moleculeStamps_)) {
        std::ostringstream oss;
        oss << "Globals Error: can not find molecule stamp for component "
            << (*i)->getType() << std::endl;
        throw OpenMDException(oss.str());
      }
    }
  }